

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O0

void __thiscall
cmCMakePresetsGraph::BuildPreset::BuildPreset(BuildPreset *this,BuildPreset *param_1)

{
  undefined2 uVar1;
  _Storage<int,_true> _Var2;
  undefined3 uVar3;
  optional<bool> oVar4;
  BuildPreset *param_1_local;
  BuildPreset *this_local;
  
  Preset::Preset(&this->super_Preset,&param_1->super_Preset);
  (this->super_Preset)._vptr_Preset = (_func_int **)&PTR__BuildPreset_011032a8;
  std::__cxx11::string::string((string *)&this->ConfigurePreset,(string *)&param_1->ConfigurePreset)
  ;
  uVar1 = *(undefined2 *)&param_1->field_0xfa;
  _Var2 = (param_1->Jobs).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_payload;
  this->InheritConfigureEnvironment =
       (_Optional_base<bool,_true,_true>)
       (param_1->InheritConfigureEnvironment).super__Optional_base<bool,_true,_true>;
  *(undefined2 *)&this->field_0xfa = uVar1;
  (this->Jobs).super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
  _M_payload = _Var2;
  uVar3 = *(undefined3 *)
           &(param_1->Jobs).super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int>.field_0x5;
  (this->Jobs).super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
  _M_engaged = (param_1->Jobs).super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>._M_engaged;
  *(undefined3 *)
   &(this->Jobs).super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
    field_0x5 = uVar3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Targets,&param_1->Targets);
  std::__cxx11::string::string((string *)&this->Configuration,(string *)&param_1->Configuration);
  oVar4.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool> =
       (param_1->Verbose).super__Optional_base<bool,_true,_true>;
  this->CleanFirst =
       (_Optional_base<bool,_true,_true>)
       (param_1->CleanFirst).super__Optional_base<bool,_true,_true>;
  this->Verbose =
       (optional<bool>)
       oVar4.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->NativeToolOptions,&param_1->NativeToolOptions);
  (this->ResolvePackageReferences).super__Optional_base<PackageResolveMode,_true,_true>._M_payload.
  super__Optional_payload_base<PackageResolveMode> =
       (param_1->ResolvePackageReferences).super__Optional_base<PackageResolveMode,_true,_true>.
       _M_payload.super__Optional_payload_base<PackageResolveMode>;
  return;
}

Assistant:

BuildPreset(BuildPreset&& /*other*/) = default;